

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O3

bool __thiscall ON_NurbsCage::IsPeriodic(ON_NurbsCage *this,int dir)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  int iVar6;
  double *pointA;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int d [3];
  ulong local_50;
  int local_48;
  int local_44;
  ulong local_40;
  ulong local_38;
  
  if (2 < (uint)dir) {
    return false;
  }
  if (0 < this->m_dim) {
    uVar9 = (ulong)(uint)dir;
    bVar2 = ON_IsKnotVectorPeriodic
                      (this->m_order[uVar9],this->m_cv_count[uVar9],this->m_knot[uVar9]);
    if (bVar2) {
      local_48 = 0;
      local_50 = 0;
      *(int *)((long)&local_50 + uVar9 * 4) = (this->m_cv_count[uVar9] - this->m_order[uVar9]) + 1;
      iVar1 = local_48;
      uVar9 = local_50 & 0xffffffff;
      iVar4 = this->m_cv_count[0];
      if ((int)local_50 < iVar4) {
        uVar10 = local_50 >> 0x20;
        iVar6 = this->m_cv_count[1];
        iVar8 = 0;
        local_40 = uVar9;
        local_38 = uVar10;
        do {
          if ((int)uVar10 < iVar6) {
            local_44 = (int)uVar9 + iVar8;
            iVar4 = this->m_cv_count[2];
            iVar7 = 0;
            do {
              if (iVar1 < iVar4) {
                iVar6 = 0;
                do {
                  pdVar5 = this->m_cv;
                  if (pdVar5 == (double *)0x0) {
                    pointA = (double *)0x0;
                    pdVar5 = (double *)0x0;
                  }
                  else {
                    pointA = pdVar5 + (long)(this->m_cv_stride[0] * iVar8) +
                                      (long)(this->m_cv_stride[1] * iVar7) +
                                      (long)(this->m_cv_stride[2] * iVar6);
                    pdVar5 = pdVar5 + (long)(this->m_cv_stride[0] * local_44) +
                                      (long)(this->m_cv_stride[1] * (iVar7 + (int)uVar10)) +
                                      (long)((iVar1 + iVar6) * this->m_cv_stride[2]);
                  }
                  bVar2 = ON_PointsAreCoincident(this->m_dim,this->m_is_rat,pointA,pdVar5);
                  if (!bVar2) {
                    return false;
                  }
                  iVar4 = this->m_cv_count[2];
                  iVar3 = iVar1 + iVar6;
                  iVar6 = iVar6 + 1;
                } while (iVar3 + 1 < iVar4);
                iVar6 = this->m_cv_count[1];
                uVar10 = local_38;
              }
              iVar3 = (int)uVar10 + iVar7;
              iVar7 = iVar7 + 1;
            } while (iVar3 + 1 < iVar6);
            iVar4 = this->m_cv_count[0];
            uVar9 = local_40;
          }
          iVar7 = (int)uVar9 + iVar8;
          iVar8 = iVar8 + 1;
        } while (iVar7 + 1 < iVar4);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_NurbsCage::IsPeriodic(int dir) const
{
  bool bIsPeriodic = false;
  if ( dir >= 0 && dir <= 2 && m_dim > 0 )
  {
    bIsPeriodic = ON_IsKnotVectorPeriodic( m_order[dir], m_cv_count[dir], m_knot[dir] );
    if ( bIsPeriodic ) 
    {
      const double *cv0, *cv1;
      int i,j,k,d[3] = {0,0,0};
      d[dir] = m_cv_count[dir] - (m_order[dir]-1);
      for ( i = 0; i+d[0] < m_cv_count[0]; i++ )
      {
        for ( j = 0; j+d[1] < m_cv_count[1]; j++ )
        {
          for ( k = 0; k+d[2] < m_cv_count[2]; k++ )
          {
            cv0 = CV(i,j,k);
            cv1 = CV(i+d[0],j+d[1],k+d[2]);
            if ( false == ON_PointsAreCoincident(m_dim, m_is_rat, cv0, cv1 ) )
              return false;
          }
        }
      }
    }
  }
  return bIsPeriodic;
}